

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChDebugDrawer::drawContactPoint
          (ChDebugDrawer *this,cbtVector3 *PointOnB,cbtVector3 *normalOnB,cbtScalar distance,
          int lifeTime,cbtVector3 *color)

{
  undefined1 auVar1 [16];
  float fVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)PointOnB->m_floats;
  vcvtps2pd_avx(auVar1);
  dVar3 = (double)(**(code **)(*(long *)this->m_vis + 0x18))();
  fVar2 = (float)dVar3;
  auVar4._0_4_ = (float)*(undefined8 *)normalOnB->m_floats * fVar2 +
                 (float)*(undefined8 *)PointOnB->m_floats;
  auVar4._4_4_ = (float)((ulong)*(undefined8 *)normalOnB->m_floats >> 0x20) * fVar2 +
                 (float)((ulong)*(undefined8 *)PointOnB->m_floats >> 0x20);
  auVar4._8_4_ = fVar2 * 0.0 + 0.0;
  auVar4._12_4_ = fVar2 * 0.0 + 0.0;
  vcvtps2pd_avx(auVar4);
  (**(code **)(*(long *)this->m_vis + 0x10))();
  return;
}

Assistant:

void drawContactPoint(const cbtVector3& PointOnB,
                          const cbtVector3& normalOnB,
                          cbtScalar distance,
                          int lifeTime,
                          const cbtVector3& color) override {
        cbtVector3 from = PointOnB;
        cbtVector3 to = PointOnB + m_vis->GetNormalScale() * normalOnB;
        m_vis->DrawLine(ChVector<>(from.x(), from.y(), from.z()), ChVector<>(to.x(), to.y(), to.z()),
                        ChColor(color.x(), color.y(), color.z()));
    }